

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gguf.cpp
# Opt level: O3

long * __thiscall gguf_kv::get_val<long>(gguf_kv *this,size_t i)

{
  pointer pcVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  ulong uVar4;
  char *pcVar5;
  int line;
  
  if (this->type != GGUF_TYPE_INT64) {
    pcVar5 = "type_to_gguf_type<T>::value == type";
    line = 0xb7;
    goto LAB_00140d83;
  }
  if (GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent == (_Base_ptr)0x0) {
LAB_00140cfd:
    p_Var3 = (_Base_ptr)0x0;
  }
  else {
    p_Var2 = &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var3 = GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
    do {
      if (10 < (int)p_Var3[1]._M_color) {
        p_Var2 = p_Var3;
      }
      p_Var3 = (&p_Var3->_M_left)[(int)p_Var3[1]._M_color < 0xb];
    } while (p_Var3 != (_Base_ptr)0x0);
    if (((_Rb_tree_header *)p_Var2 == &GGUF_TYPE_SIZE._M_t._M_impl.super__Rb_tree_header) ||
       (0xb < (int)p_Var2[1]._M_color)) goto LAB_00140cfd;
    p_Var3 = p_Var2[1]._M_parent;
  }
  pcVar1 = (this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar4 = (long)(this->data).super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)pcVar1;
  if (uVar4 % (ulong)p_Var3 == 0) {
    if ((long)p_Var3 * (i + 1) <= uVar4) {
      return (long *)(pcVar1 + i * 8);
    }
    pcVar5 = "data.size() >= (i+1)*type_size";
    line = 0xbe;
  }
  else {
    pcVar5 = "data.size() % type_size == 0";
    line = 0xbd;
  }
LAB_00140d83:
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/gguf.cpp"
             ,line,"GGML_ASSERT(%s) failed",pcVar5);
}

Assistant:

const T & get_val(const size_t i = 0) const {
        GGML_ASSERT(type_to_gguf_type<T>::value == type);
        if constexpr (std::is_same<T, std::string>::value) {
            GGML_ASSERT(data_string.size() >= i+1);
            return data_string[i];
        }
        const size_t type_size = gguf_type_size(type);
        GGML_ASSERT(data.size() % type_size == 0);
        GGML_ASSERT(data.size() >= (i+1)*type_size);
        return reinterpret_cast<const T *>(data.data())[i];
    }